

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

void libtorrent::aux::append_utf8_codepoint(string *ret,int32_t codepoint)

{
  char cVar1;
  int local_1c;
  int local_18;
  int i;
  int seq_len;
  int32_t codepoint_local;
  string *ret_local;
  
  i = codepoint;
  if ((0xd7ff < codepoint) && (codepoint < 0xe000)) {
    i = 0x5f;
  }
  if (0x10ffff < i) {
    i = 0x5f;
  }
  if (i < 0x80) {
    local_18 = 1;
  }
  else if (i < 0x800) {
    local_18 = 2;
  }
  else if (i < 0x10000) {
    local_18 = 3;
  }
  else {
    local_18 = 4;
  }
  cVar1 = (char)ret;
  switch(local_18) {
  case 1:
    ::std::__cxx11::string::push_back(cVar1);
    break;
  case 2:
    ::std::__cxx11::string::push_back(cVar1);
    break;
  case 3:
    ::std::__cxx11::string::push_back(cVar1);
    break;
  case 4:
    ::std::__cxx11::string::push_back(cVar1);
  }
  for (local_1c = local_18 + -2; -1 < local_1c; local_1c = local_1c + -1) {
    ::std::__cxx11::string::push_back(cVar1);
  }
  return;
}

Assistant:

void append_utf8_codepoint(std::string& ret, std::int32_t codepoint)
	{
		if (codepoint >= surrogate_start
			&& codepoint <= surrogate_end)
			codepoint = '_';

		if (codepoint > max_codepoint)
			codepoint = '_';

		int seq_len = 0;
		if (codepoint < 0x80) seq_len = 1;
		else if (codepoint < 0x800) seq_len = 2;
		else if (codepoint < 0x10000) seq_len = 3;
		else seq_len = 4;

		switch (seq_len)
		{
			case 1:
				ret.push_back(static_cast<char>(codepoint));
				break;
			case 2:
				ret.push_back(static_cast<char>(0b11000000 | (codepoint >> 6)));
				break;
			case 3:
				ret.push_back(static_cast<char>(0b11100000 | (codepoint >> 12)));
				break;
			case 4:
				ret.push_back(static_cast<char>(0b11110000 | (codepoint >> 18)));
				break;
		}

		for (int i = seq_len - 2; i >= 0; --i)
			ret.push_back(static_cast<char>(0b10000000 | ((codepoint >> (6 * i)) & 0b111111)));
	}